

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O0

ggml_cgraph * PCA::build_graph_piter(pca_params *params,pca_model *model,bool calc_square)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  ggml_cgraph *pgVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  byte in_DL;
  long in_RSI;
  long in_RDI;
  ggml_tensor *new_sub_old;
  int i;
  ggml_tensor *input_square;
  ggml_tensor *old_eigen;
  ggml_tensor *distance;
  ggml_tensor *b_tensor;
  ggml_tensor *tmp_square;
  ggml_cgraph *gf;
  ggml_context *ctx0;
  ggml_init_params params0;
  allocator_type *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff00;
  undefined8 uVar10;
  undefined8 local_d0;
  int local_94;
  undefined8 local_88;
  undefined8 local_70;
  
  if (*(int *)(in_RDI + 4) < 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/pca.hpp"
               ,0x8a,"GGML_ASSERT(%s) failed","params.n_batch > 0");
  }
  if (build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf_size == '\0') {
    iVar1 = __cxa_guard_acquire(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                 ::buf_size);
    if (iVar1 != 0) {
      lVar2 = ggml_tensor_overhead();
      lVar3 = ggml_graph_overhead();
      build_graph_piter::buf_size = lVar2 * 0x800 + lVar3;
      __cxa_guard_release(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::
                           buf_size);
    }
  }
  if (build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf == '\0') {
    iVar1 = __cxa_guard_acquire(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)
                                 ::buf);
    if (iVar1 != 0) {
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x17c27f);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x17c2a4);
      __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                   &build_graph_piter::buf,&__dso_handle);
      __cxa_guard_release(&build_graph_piter(PCA::pca_params_const&,PCA::pca_model_const&,bool)::buf
                         );
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x17c2e5);
  uVar4 = ggml_init();
  pgVar5 = (ggml_cgraph *)ggml_new_graph(uVar4);
  if ((in_DL & 1) != 0) {
    local_70 = ggml_mul_mat(uVar4,*(undefined8 *)(in_RSI + 0x20),*(undefined8 *)(in_RSI + 0x20));
    ggml_set_name(local_70,"tmp_square");
  }
  if ((in_DL & 1) == 0) {
    local_d0 = *(undefined8 *)(in_RSI + 0x28);
  }
  else {
    local_d0 = local_70;
  }
  local_88 = *(undefined8 *)(in_RSI + 0x30);
  for (local_94 = 0; local_94 < *(int *)(in_RDI + 4); local_94 = local_94 + 1) {
    uVar6 = ggml_mul_mat(uVar4,local_d0,local_88);
    ggml_set_name(uVar6,"b_tensor");
    uVar8 = uVar4;
    uVar9 = uVar4;
    uVar10 = uVar4;
    uVar7 = ggml_sqr(uVar4,uVar6);
    uVar8 = ggml_sum_rows(uVar8,uVar7);
    uVar8 = ggml_sqrt_inplace(uVar9,uVar8);
    uVar8 = ggml_div_inplace(uVar10,uVar6,uVar8);
    ggml_format_name(uVar8,"b_tensor_norm_%d",local_94);
    uVar9 = ggml_scale(0xbf800000,uVar4,uVar8);
    uVar9 = ggml_add(uVar4,local_88,uVar9);
    uVar9 = ggml_sqr_inplace(uVar4,uVar9);
    uVar9 = ggml_sum_rows(uVar4,uVar9);
    uVar9 = ggml_sqrt_inplace(uVar4,uVar9);
    ggml_format_name(uVar9,"distance_%d",local_94);
    ggml_build_forward_expand(pgVar5,uVar9);
    local_88 = uVar8;
  }
  ggml_free(uVar4);
  return pgVar5;
}

Assistant:

static struct ggml_cgraph * build_graph_piter(
        const struct pca_params & params,
        const pca_model & model,
        bool calc_square = false) {
    GGML_ASSERT(params.n_batch > 0);
    // TODO: buf_size must be able to scale with params.n_batch
    static size_t buf_size = ggml_tensor_overhead()*GGML_DEFAULT_GRAPH_SIZE + ggml_graph_overhead();
    static std::vector<uint8_t> buf(buf_size);

    struct ggml_init_params params0 = {
        /*.mem_size   =*/ buf_size,
        /*.mem_buffer =*/ buf.data(),
        /*.no_alloc   =*/ true, // the tensors will be allocated later by ggml_allocr_alloc_graph()
    };
    // create a temporally context to build the graph
    struct ggml_context * ctx0 = ggml_init(params0);
    struct ggml_cgraph * gf = ggml_new_graph(ctx0);

    // turn v_diff_original into square matrix if needed
    struct ggml_tensor * tmp_square;
    if (calc_square) {
        tmp_square = ggml_mul_mat(ctx0, model.dev_input, model.dev_input);
        ggml_set_name(tmp_square, "tmp_square");
    }

    struct ggml_tensor * b_tensor;
    struct ggml_tensor * distance;
    struct ggml_tensor * old_eigen    = model.dev_eigenvector;
    struct ggml_tensor * input_square = calc_square ? tmp_square : model.dev_square;

    for (int i = 0; i < params.n_batch; ++i) {
        // b_tensor = square * eigenvector^T
        b_tensor = ggml_mul_mat(ctx0, input_square, old_eigen);
        ggml_set_name(b_tensor, "b_tensor");

        // normalize
        b_tensor = ggml_div_inplace(ctx0,
            b_tensor,
            ggml_sqrt_inplace(ctx0, ggml_sum_rows(ctx0, ggml_sqr(ctx0, b_tensor)))
        );
        ggml_format_name(b_tensor, "b_tensor_norm_%d", i);

        // calculate distance(new eigenvector - old eigenvector)
        // we don't use ggml_sub because it may not be implemented on GPU backend
        struct ggml_tensor * new_sub_old = ggml_add(ctx0, old_eigen, ggml_scale(ctx0, b_tensor, -1));
        distance = ggml_sqrt_inplace(ctx0,
            ggml_sum_rows(ctx0, ggml_sqr_inplace(ctx0, new_sub_old)));
        ggml_format_name(distance, "distance_%d", i);

        old_eigen = b_tensor;

        // build operations nodes
        ggml_build_forward_expand(gf, distance);
    }

    // delete the temporally context used to build the graph
    ggml_free(ctx0);
    return gf;
}